

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointer.h
# Opt level: O1

QPointer<QWidget> * __thiscall QPointer<QWidget>::operator=(QPointer<QWidget> *this,QWidget *p)

{
  Data *pDVar1;
  Data *pDVar2;
  
  if (p == (QWidget *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&p->super_QObject);
  }
  pDVar1 = (this->wp).d;
  (this->wp).d = pDVar2;
  (this->wp).value = &p->super_QObject;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  return this;
}

Assistant:

inline QPointer<T> &operator=(T* p)
    { wp.assign(static_cast<QObjectType*>(p)); return *this; }